

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OSTEI_VRR_Algorithm_Base.cpp
# Opt level: O2

QAMList * __thiscall
OSTEI_VRR_Algorithm_Base::GenerateAMReq
          (QAMList *__return_storage_ptr__,OSTEI_VRR_Algorithm_Base *this,QAM *am,RRStepType rrstep,
          bool all)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  undefined8 uVar5;
  bool bVar6;
  string *this_00;
  undefined3 in_register_00000081;
  undefined4 uVar7;
  QAM *__x;
  QAMList req;
  allocator local_361;
  undefined1 local_360 [16];
  _Alloc_hider local_350;
  size_type local_348;
  char local_340 [20];
  undefined4 local_32c;
  undefined8 local_328;
  undefined8 uStack_320;
  undefined1 local_318 [16];
  pointer local_308;
  undefined8 local_2f8;
  undefined8 uStack_2f0;
  char *local_2e0;
  size_type local_2d8;
  char local_2d0 [8];
  undefined8 uStack_2c8;
  char *local_2c0;
  size_type local_2b8;
  char local_2b0 [8];
  undefined8 uStack_2a8;
  char *local_2a0;
  size_type local_298;
  char local_290 [8];
  undefined8 uStack_288;
  char *local_280;
  size_type local_278;
  char local_270 [8];
  undefined8 uStack_268;
  char *local_260;
  size_type local_258;
  char local_250 [8];
  undefined8 uStack_248;
  char *local_240;
  size_type local_238;
  char local_230 [8];
  undefined8 uStack_228;
  char *local_220;
  size_type local_218;
  char local_210 [8];
  undefined8 uStack_208;
  char *local_200;
  size_type local_1f8;
  char local_1f0 [8];
  undefined8 uStack_1e8;
  char *local_1e0;
  size_type local_1d8;
  char local_1d0 [8];
  undefined8 uStack_1c8;
  char *local_1c0;
  size_type local_1b8;
  char local_1b0 [8];
  undefined8 uStack_1a8;
  char *local_1a0;
  size_type local_198;
  char local_190 [8];
  undefined8 uStack_188;
  char *local_180;
  size_type local_178;
  char local_170 [8];
  undefined8 uStack_168;
  char *local_160;
  size_type local_158;
  char local_150 [8];
  undefined8 uStack_148;
  char *local_140;
  size_type local_138;
  char local_130 [8];
  undefined8 uStack_128;
  char *local_120;
  size_type local_118;
  char local_110 [8];
  undefined8 uStack_108;
  char *local_100;
  size_type local_f8;
  char local_f0 [8];
  undefined8 uStack_e8;
  char *local_e0;
  size_type local_d8;
  char local_d0 [8];
  undefined8 uStack_c8;
  char *local_c0;
  size_type local_b8;
  char local_b0 [8];
  undefined8 uStack_a8;
  char *local_a0;
  size_type local_98;
  char local_90 [8];
  undefined8 uStack_88;
  char *local_80;
  size_type local_78;
  char local_70 [8];
  undefined8 uStack_68;
  undefined1 local_60 [48];
  
  uVar7 = CONCAT31(in_register_00000081,all);
  local_318 = (undefined1  [16])0x0;
  local_308 = (pointer)0x0;
  switch(rrstep) {
  case I:
    iVar1 = (am->qam)._M_elems[0];
    iVar2 = (am->qam)._M_elems[3];
    local_328 = *(undefined8 *)((am->qam)._M_elems + 1);
    uStack_320 = 0;
    local_32c = uVar7;
    std::__cxx11::string::string((string *)&local_80,"",&local_361);
    local_360._0_4_ = iVar1 + -1;
    local_360._4_4_ = (undefined4)local_328;
    local_360._8_4_ = (undefined4)((ulong)local_328 >> 0x20);
    if (local_80 == local_70) {
      local_340[8] = (undefined1)uStack_68;
      local_340[9] = uStack_68._1_1_;
      local_340[10] = uStack_68._2_1_;
      local_340[0xb] = uStack_68._3_1_;
      local_340[0xc] = uStack_68._4_1_;
      local_340[0xd] = uStack_68._5_1_;
      local_340[0xe] = uStack_68._6_1_;
      local_340[0xf] = uStack_68._7_1_;
      local_350._M_p = local_340;
    }
    else {
      local_350._M_p = local_80;
    }
    local_348 = local_78;
    local_78 = 0;
    local_70[0] = '\0';
    local_360._12_4_ = iVar2;
    local_80 = local_70;
    std::vector<QAM,_std::allocator<QAM>_>::emplace_back<QAM>
              ((vector<QAM,_std::allocator<QAM>_> *)local_318,(QAM *)local_360);
    std::__cxx11::string::~string((string *)&local_350);
    std::__cxx11::string::~string((string *)&local_80);
    iVar1 = (am->qam)._M_elems[0];
    iVar2 = (am->qam)._M_elems[3];
    local_328 = *(undefined8 *)((am->qam)._M_elems + 1);
    uStack_320 = 0;
    std::__cxx11::string::string((string *)&local_a0,"",&local_361);
    local_360._0_4_ = iVar1 + -2;
    local_360._4_4_ = (undefined4)local_328;
    local_360._8_4_ = (undefined4)((ulong)local_328 >> 0x20);
    if (local_a0 == local_90) {
      local_340[8] = (undefined1)uStack_88;
      local_340[9] = uStack_88._1_1_;
      local_340[10] = uStack_88._2_1_;
      local_340[0xb] = uStack_88._3_1_;
      local_340[0xc] = uStack_88._4_1_;
      local_340[0xd] = uStack_88._5_1_;
      local_340[0xe] = uStack_88._6_1_;
      local_340[0xf] = uStack_88._7_1_;
      local_350._M_p = local_340;
    }
    else {
      local_350._M_p = local_a0;
    }
    local_348 = local_98;
    local_98 = 0;
    local_90[0] = '\0';
    local_360._12_4_ = iVar2;
    local_a0 = local_90;
    std::vector<QAM,_std::allocator<QAM>_>::emplace_back<QAM>
              ((vector<QAM,_std::allocator<QAM>_> *)local_318,(QAM *)local_360);
    std::__cxx11::string::~string((string *)&local_350);
    std::__cxx11::string::~string((string *)&local_a0);
    local_328 = *(undefined8 *)(am->qam)._M_elems;
    uStack_320 = 0;
    local_2f8 = *(undefined8 *)((am->qam)._M_elems + 2);
    uStack_2f0 = 0;
    std::__cxx11::string::string((string *)&local_c0,"",&local_361);
    local_360._0_4_ = (int)local_328 + -1;
    local_360._4_4_ = local_328._4_4_ + -1;
    local_360._8_4_ = (undefined4)local_2f8;
    local_360._12_4_ = (undefined4)((ulong)local_2f8 >> 0x20);
    if (local_c0 == local_b0) {
      local_340[8] = (undefined1)uStack_a8;
      local_340[9] = uStack_a8._1_1_;
      local_340[10] = uStack_a8._2_1_;
      local_340[0xb] = uStack_a8._3_1_;
      local_340[0xc] = uStack_a8._4_1_;
      local_340[0xd] = uStack_a8._5_1_;
      local_340[0xe] = uStack_a8._6_1_;
      local_340[0xf] = uStack_a8._7_1_;
      local_350._M_p = local_340;
    }
    else {
      local_350._M_p = local_c0;
    }
    local_348 = local_b8;
    local_b8 = 0;
    local_b0[0] = '\0';
    local_c0 = local_b0;
    std::vector<QAM,_std::allocator<QAM>_>::emplace_back<QAM>
              ((vector<QAM,_std::allocator<QAM>_> *)local_318,(QAM *)local_360);
    std::__cxx11::string::~string((string *)&local_350);
    std::__cxx11::string::~string((string *)&local_c0);
    iVar1 = (am->qam)._M_elems[0];
    iVar2 = (am->qam)._M_elems[1];
    iVar3 = (am->qam)._M_elems[2];
    iVar4 = (am->qam)._M_elems[3];
    std::__cxx11::string::string((string *)&local_e0,"",&local_361);
    uVar7 = local_32c;
    local_360._8_4_ = iVar3 + -1;
    local_360._0_4_ = iVar1 + -1;
    if (local_e0 == local_d0) {
      local_340[8] = (undefined1)uStack_c8;
      local_340[9] = uStack_c8._1_1_;
      local_340[10] = uStack_c8._2_1_;
      local_340[0xb] = uStack_c8._3_1_;
      local_340[0xc] = uStack_c8._4_1_;
      local_340[0xd] = uStack_c8._5_1_;
      local_340[0xe] = uStack_c8._6_1_;
      local_340[0xf] = uStack_c8._7_1_;
      local_350._M_p = local_340;
    }
    else {
      local_350._M_p = local_e0;
    }
    local_348 = local_d8;
    local_d8 = 0;
    local_d0[0] = '\0';
    local_360._4_4_ = iVar2;
    local_360._12_4_ = iVar4;
    local_e0 = local_d0;
    std::vector<QAM,_std::allocator<QAM>_>::emplace_back<QAM>
              ((vector<QAM,_std::allocator<QAM>_> *)local_318,(QAM *)local_360);
    std::__cxx11::string::~string((string *)&local_350);
    std::__cxx11::string::~string((string *)&local_e0);
    iVar1 = (am->qam)._M_elems[0];
    iVar2 = (am->qam)._M_elems[3];
    local_328 = *(undefined8 *)((am->qam)._M_elems + 1);
    uStack_320 = 0;
    std::__cxx11::string::string((string *)&local_100,"",&local_361);
    local_360._12_4_ = iVar2 + -1;
    local_360._0_4_ = iVar1 + -1;
    local_360._4_4_ = (undefined4)local_328;
    local_360._8_4_ = (undefined4)((ulong)local_328 >> 0x20);
    if (local_100 == local_f0) {
      local_340[8] = (undefined1)uStack_e8;
      local_340[9] = uStack_e8._1_1_;
      local_340[10] = uStack_e8._2_1_;
      local_340[0xb] = uStack_e8._3_1_;
      local_340[0xc] = uStack_e8._4_1_;
      local_340[0xd] = uStack_e8._5_1_;
      local_340[0xe] = uStack_e8._6_1_;
      local_340[0xf] = uStack_e8._7_1_;
      local_350._M_p = local_340;
    }
    else {
      local_350._M_p = local_100;
    }
    local_348 = local_f8;
    local_f8 = 0;
    local_f0[0] = '\0';
    local_100 = local_f0;
    std::vector<QAM,_std::allocator<QAM>_>::emplace_back<QAM>
              ((vector<QAM,_std::allocator<QAM>_> *)local_318,(QAM *)local_360);
    std::__cxx11::string::~string((string *)&local_350);
    this_00 = (string *)&local_100;
    break;
  case J:
    iVar1 = (am->qam)._M_elems[0];
    iVar2 = (am->qam)._M_elems[1];
    local_328 = *(undefined8 *)((am->qam)._M_elems + 2);
    uStack_320 = 0;
    local_32c = uVar7;
    std::__cxx11::string::string((string *)&local_120,"",&local_361);
    local_360._4_4_ = iVar2 + -1;
    local_360._8_4_ = (undefined4)local_328;
    local_360._12_4_ = (undefined4)((ulong)local_328 >> 0x20);
    if (local_120 == local_110) {
      local_340[8] = (undefined1)uStack_108;
      local_340[9] = uStack_108._1_1_;
      local_340[10] = uStack_108._2_1_;
      local_340[0xb] = uStack_108._3_1_;
      local_340[0xc] = uStack_108._4_1_;
      local_340[0xd] = uStack_108._5_1_;
      local_340[0xe] = uStack_108._6_1_;
      local_340[0xf] = uStack_108._7_1_;
      local_350._M_p = local_340;
    }
    else {
      local_350._M_p = local_120;
    }
    local_348 = local_118;
    local_118 = 0;
    local_110[0] = '\0';
    local_360._0_4_ = iVar1;
    local_120 = local_110;
    std::vector<QAM,_std::allocator<QAM>_>::emplace_back<QAM>
              ((vector<QAM,_std::allocator<QAM>_> *)local_318,(QAM *)local_360);
    std::__cxx11::string::~string((string *)&local_350);
    std::__cxx11::string::~string((string *)&local_120);
    local_328 = *(undefined8 *)(am->qam)._M_elems;
    uStack_320 = 0;
    local_2f8 = *(undefined8 *)((am->qam)._M_elems + 2);
    uStack_2f0 = 0;
    std::__cxx11::string::string((string *)&local_140,"",&local_361);
    local_360._0_4_ = (int)local_328 + -1;
    local_360._4_4_ = local_328._4_4_ + -1;
    local_360._8_4_ = (undefined4)local_2f8;
    local_360._12_4_ = (undefined4)((ulong)local_2f8 >> 0x20);
    if (local_140 == local_130) {
      local_340[8] = (undefined1)uStack_128;
      local_340[9] = uStack_128._1_1_;
      local_340[10] = uStack_128._2_1_;
      local_340[0xb] = uStack_128._3_1_;
      local_340[0xc] = uStack_128._4_1_;
      local_340[0xd] = uStack_128._5_1_;
      local_340[0xe] = uStack_128._6_1_;
      local_340[0xf] = uStack_128._7_1_;
      local_350._M_p = local_340;
    }
    else {
      local_350._M_p = local_140;
    }
    local_348 = local_138;
    local_138 = 0;
    local_130[0] = '\0';
    local_140 = local_130;
    std::vector<QAM,_std::allocator<QAM>_>::emplace_back<QAM>
              ((vector<QAM,_std::allocator<QAM>_> *)local_318,(QAM *)local_360);
    std::__cxx11::string::~string((string *)&local_350);
    std::__cxx11::string::~string((string *)&local_140);
    iVar1 = (am->qam)._M_elems[0];
    iVar2 = (am->qam)._M_elems[1];
    local_328 = *(undefined8 *)((am->qam)._M_elems + 2);
    uStack_320 = 0;
    std::__cxx11::string::string((string *)&local_160,"",&local_361);
    local_360._4_4_ = iVar2 + -2;
    local_360._8_4_ = (undefined4)local_328;
    local_360._12_4_ = (undefined4)((ulong)local_328 >> 0x20);
    if (local_160 == local_150) {
      local_340[8] = (undefined1)uStack_148;
      local_340[9] = uStack_148._1_1_;
      local_340[10] = uStack_148._2_1_;
      local_340[0xb] = uStack_148._3_1_;
      local_340[0xc] = uStack_148._4_1_;
      local_340[0xd] = uStack_148._5_1_;
      local_340[0xe] = uStack_148._6_1_;
      local_340[0xf] = uStack_148._7_1_;
      local_350._M_p = local_340;
    }
    else {
      local_350._M_p = local_160;
    }
    local_348 = local_158;
    local_158 = 0;
    local_150[0] = '\0';
    local_360._0_4_ = iVar1;
    local_160 = local_150;
    std::vector<QAM,_std::allocator<QAM>_>::emplace_back<QAM>
              ((vector<QAM,_std::allocator<QAM>_> *)local_318,(QAM *)local_360);
    std::__cxx11::string::~string((string *)&local_350);
    std::__cxx11::string::~string((string *)&local_160);
    iVar1 = (am->qam)._M_elems[0];
    iVar2 = (am->qam)._M_elems[3];
    local_328 = *(undefined8 *)((am->qam)._M_elems + 1);
    uStack_320 = 0;
    std::__cxx11::string::string((string *)&local_180,"",&local_361);
    local_360._4_4_ = (int)local_328 + -1;
    local_360._8_4_ = local_328._4_4_ + -1;
    if (local_180 == local_170) {
      local_340[8] = (undefined1)uStack_168;
      local_340[9] = uStack_168._1_1_;
      local_340[10] = uStack_168._2_1_;
      local_340[0xb] = uStack_168._3_1_;
      local_340[0xc] = uStack_168._4_1_;
      local_340[0xd] = uStack_168._5_1_;
      local_340[0xe] = uStack_168._6_1_;
      local_340[0xf] = uStack_168._7_1_;
      local_350._M_p = local_340;
    }
    else {
      local_350._M_p = local_180;
    }
    local_348 = local_178;
    local_178 = 0;
    local_170[0] = '\0';
    local_360._0_4_ = iVar1;
    local_360._12_4_ = iVar2;
    local_180 = local_170;
    std::vector<QAM,_std::allocator<QAM>_>::emplace_back<QAM>
              ((vector<QAM,_std::allocator<QAM>_> *)local_318,(QAM *)local_360);
    std::__cxx11::string::~string((string *)&local_350);
    std::__cxx11::string::~string((string *)&local_180);
    iVar1 = (am->qam)._M_elems[0];
    iVar2 = (am->qam)._M_elems[1];
    iVar3 = (am->qam)._M_elems[2];
    iVar4 = (am->qam)._M_elems[3];
    std::__cxx11::string::string((string *)&local_1a0,"",&local_361);
    uVar7 = local_32c;
    local_360._12_4_ = iVar4 + -1;
    local_360._4_4_ = iVar2 + -1;
    local_350._M_p = local_340;
    if (local_1a0 == local_190) {
      local_340[8] = (undefined1)uStack_188;
      local_340[9] = uStack_188._1_1_;
      local_340[10] = uStack_188._2_1_;
      local_340[0xb] = uStack_188._3_1_;
      local_340[0xc] = uStack_188._4_1_;
      local_340[0xd] = uStack_188._5_1_;
      local_340[0xe] = uStack_188._6_1_;
      local_340[0xf] = uStack_188._7_1_;
    }
    else {
      local_350._M_p = local_1a0;
    }
    local_348 = local_198;
    local_198 = 0;
    local_190[0] = '\0';
    local_360._0_4_ = iVar1;
    local_360._8_4_ = iVar3;
    local_1a0 = local_190;
    std::vector<QAM,_std::allocator<QAM>_>::emplace_back<QAM>
              ((vector<QAM,_std::allocator<QAM>_> *)local_318,(QAM *)local_360);
    std::__cxx11::string::~string((string *)&local_350);
    this_00 = (string *)&local_1a0;
    break;
  case K:
    local_328 = *(undefined8 *)(am->qam)._M_elems;
    uStack_320 = 0;
    iVar1 = (am->qam)._M_elems[2];
    iVar2 = (am->qam)._M_elems[3];
    local_32c = uVar7;
    std::__cxx11::string::string((string *)&local_1c0,"",&local_361);
    local_360._8_4_ = iVar1 + -1;
    local_360._0_4_ = (undefined4)local_328;
    local_360._4_4_ = (undefined4)((ulong)local_328 >> 0x20);
    if (local_1c0 == local_1b0) {
      local_340[8] = (undefined1)uStack_1a8;
      local_340[9] = uStack_1a8._1_1_;
      local_340[10] = uStack_1a8._2_1_;
      local_340[0xb] = uStack_1a8._3_1_;
      local_340[0xc] = uStack_1a8._4_1_;
      local_340[0xd] = uStack_1a8._5_1_;
      local_340[0xe] = uStack_1a8._6_1_;
      local_340[0xf] = uStack_1a8._7_1_;
      local_350._M_p = local_340;
    }
    else {
      local_350._M_p = local_1c0;
    }
    local_348 = local_1b8;
    local_1b8 = 0;
    local_1b0[0] = '\0';
    local_360._12_4_ = iVar2;
    local_1c0 = local_1b0;
    std::vector<QAM,_std::allocator<QAM>_>::emplace_back<QAM>
              ((vector<QAM,_std::allocator<QAM>_> *)local_318,(QAM *)local_360);
    std::__cxx11::string::~string((string *)&local_350);
    std::__cxx11::string::~string((string *)&local_1c0);
    local_328 = *(undefined8 *)(am->qam)._M_elems;
    uStack_320 = 0;
    iVar1 = (am->qam)._M_elems[2];
    iVar2 = (am->qam)._M_elems[3];
    std::__cxx11::string::string((string *)&local_1e0,"",&local_361);
    local_360._8_4_ = iVar1 + -2;
    local_360._0_4_ = (undefined4)local_328;
    local_360._4_4_ = (undefined4)((ulong)local_328 >> 0x20);
    if (local_1e0 == local_1d0) {
      local_340[8] = (undefined1)uStack_1c8;
      local_340[9] = uStack_1c8._1_1_;
      local_340[10] = uStack_1c8._2_1_;
      local_340[0xb] = uStack_1c8._3_1_;
      local_340[0xc] = uStack_1c8._4_1_;
      local_340[0xd] = uStack_1c8._5_1_;
      local_340[0xe] = uStack_1c8._6_1_;
      local_340[0xf] = uStack_1c8._7_1_;
      local_350._M_p = local_340;
    }
    else {
      local_350._M_p = local_1e0;
    }
    local_348 = local_1d8;
    local_1d8 = 0;
    local_1d0[0] = '\0';
    local_360._12_4_ = iVar2;
    local_1e0 = local_1d0;
    std::vector<QAM,_std::allocator<QAM>_>::emplace_back<QAM>
              ((vector<QAM,_std::allocator<QAM>_> *)local_318,(QAM *)local_360);
    std::__cxx11::string::~string((string *)&local_350);
    std::__cxx11::string::~string((string *)&local_1e0);
    local_328 = *(undefined8 *)(am->qam)._M_elems;
    uStack_320 = 0;
    local_2f8 = *(undefined8 *)((am->qam)._M_elems + 2);
    uStack_2f0 = 0;
    std::__cxx11::string::string((string *)&local_200,"",&local_361);
    local_360._8_4_ = (int)local_2f8 + -1;
    local_360._12_4_ = local_2f8._4_4_ + -1;
    local_360._0_4_ = (undefined4)local_328;
    local_360._4_4_ = (undefined4)((ulong)local_328 >> 0x20);
    if (local_200 == local_1f0) {
      local_340[8] = (undefined1)uStack_1e8;
      local_340[9] = uStack_1e8._1_1_;
      local_340[10] = uStack_1e8._2_1_;
      local_340[0xb] = uStack_1e8._3_1_;
      local_340[0xc] = uStack_1e8._4_1_;
      local_340[0xd] = uStack_1e8._5_1_;
      local_340[0xe] = uStack_1e8._6_1_;
      local_340[0xf] = uStack_1e8._7_1_;
      local_350._M_p = local_340;
    }
    else {
      local_350._M_p = local_200;
    }
    local_348 = local_1f8;
    local_1f8 = 0;
    local_1f0[0] = '\0';
    local_200 = local_1f0;
    std::vector<QAM,_std::allocator<QAM>_>::emplace_back<QAM>
              ((vector<QAM,_std::allocator<QAM>_> *)local_318,(QAM *)local_360);
    std::__cxx11::string::~string((string *)&local_350);
    std::__cxx11::string::~string((string *)&local_200);
    iVar1 = (am->qam)._M_elems[0];
    iVar2 = (am->qam)._M_elems[1];
    iVar3 = (am->qam)._M_elems[2];
    iVar4 = (am->qam)._M_elems[3];
    std::__cxx11::string::string((string *)&local_220,"",&local_361);
    uVar7 = local_32c;
    local_360._8_4_ = iVar3 + -1;
    local_360._0_4_ = iVar1 + -1;
    if (local_220 == local_210) {
      local_340[8] = (undefined1)uStack_208;
      local_340[9] = uStack_208._1_1_;
      local_340[10] = uStack_208._2_1_;
      local_340[0xb] = uStack_208._3_1_;
      local_340[0xc] = uStack_208._4_1_;
      local_340[0xd] = uStack_208._5_1_;
      local_340[0xe] = uStack_208._6_1_;
      local_340[0xf] = uStack_208._7_1_;
      local_350._M_p = local_340;
    }
    else {
      local_350._M_p = local_220;
    }
    local_348 = local_218;
    local_218 = 0;
    local_210[0] = '\0';
    local_360._4_4_ = iVar2;
    local_360._12_4_ = iVar4;
    local_220 = local_210;
    std::vector<QAM,_std::allocator<QAM>_>::emplace_back<QAM>
              ((vector<QAM,_std::allocator<QAM>_> *)local_318,(QAM *)local_360);
    std::__cxx11::string::~string((string *)&local_350);
    std::__cxx11::string::~string((string *)&local_220);
    iVar1 = (am->qam)._M_elems[0];
    iVar2 = (am->qam)._M_elems[3];
    local_328 = *(undefined8 *)((am->qam)._M_elems + 1);
    uStack_320 = 0;
    std::__cxx11::string::string((string *)&local_240,"",&local_361);
    local_360._4_4_ = (int)local_328 + -1;
    local_360._8_4_ = local_328._4_4_ + -1;
    if (local_240 == local_230) {
      local_340[8] = (undefined1)uStack_228;
      local_340[9] = uStack_228._1_1_;
      local_340[10] = uStack_228._2_1_;
      local_340[0xb] = uStack_228._3_1_;
      local_340[0xc] = uStack_228._4_1_;
      local_340[0xd] = uStack_228._5_1_;
      local_340[0xe] = uStack_228._6_1_;
      local_340[0xf] = uStack_228._7_1_;
      local_350._M_p = local_340;
    }
    else {
      local_350._M_p = local_240;
    }
    local_348 = local_238;
    local_238 = 0;
    local_230[0] = '\0';
    local_360._0_4_ = iVar1;
    local_360._12_4_ = iVar2;
    local_240 = local_230;
    std::vector<QAM,_std::allocator<QAM>_>::emplace_back<QAM>
              ((vector<QAM,_std::allocator<QAM>_> *)local_318,(QAM *)local_360);
    std::__cxx11::string::~string((string *)&local_350);
    this_00 = (string *)&local_240;
    break;
  case L:
    local_328 = *(undefined8 *)(am->qam)._M_elems;
    uStack_320 = 0;
    iVar1 = (am->qam)._M_elems[2];
    iVar2 = (am->qam)._M_elems[3];
    local_32c = uVar7;
    std::__cxx11::string::string((string *)&local_260,"",&local_361);
    local_360._12_4_ = iVar2 + -1;
    local_360._0_4_ = (undefined4)local_328;
    local_360._4_4_ = (undefined4)((ulong)local_328 >> 0x20);
    if (local_260 == local_250) {
      local_340[8] = (undefined1)uStack_248;
      local_340[9] = uStack_248._1_1_;
      local_340[10] = uStack_248._2_1_;
      local_340[0xb] = uStack_248._3_1_;
      local_340[0xc] = uStack_248._4_1_;
      local_340[0xd] = uStack_248._5_1_;
      local_340[0xe] = uStack_248._6_1_;
      local_340[0xf] = uStack_248._7_1_;
      local_350._M_p = local_340;
    }
    else {
      local_350._M_p = local_260;
    }
    local_348 = local_258;
    local_258 = 0;
    local_250[0] = '\0';
    local_360._8_4_ = iVar1;
    local_260 = local_250;
    std::vector<QAM,_std::allocator<QAM>_>::emplace_back<QAM>
              ((vector<QAM,_std::allocator<QAM>_> *)local_318,(QAM *)local_360);
    std::__cxx11::string::~string((string *)&local_350);
    std::__cxx11::string::~string((string *)&local_260);
    local_328 = *(undefined8 *)(am->qam)._M_elems;
    uStack_320 = 0;
    local_2f8 = *(undefined8 *)((am->qam)._M_elems + 2);
    uStack_2f0 = 0;
    std::__cxx11::string::string((string *)&local_280,"",&local_361);
    local_360._8_4_ = (int)local_2f8 + -1;
    local_360._12_4_ = local_2f8._4_4_ + -1;
    local_360._0_4_ = (undefined4)local_328;
    local_360._4_4_ = (undefined4)((ulong)local_328 >> 0x20);
    if (local_280 == local_270) {
      local_340[8] = (undefined1)uStack_268;
      local_340[9] = uStack_268._1_1_;
      local_340[10] = uStack_268._2_1_;
      local_340[0xb] = uStack_268._3_1_;
      local_340[0xc] = uStack_268._4_1_;
      local_340[0xd] = uStack_268._5_1_;
      local_340[0xe] = uStack_268._6_1_;
      local_340[0xf] = uStack_268._7_1_;
      local_350._M_p = local_340;
    }
    else {
      local_350._M_p = local_280;
    }
    local_348 = local_278;
    local_278 = 0;
    local_270[0] = '\0';
    local_280 = local_270;
    std::vector<QAM,_std::allocator<QAM>_>::emplace_back<QAM>
              ((vector<QAM,_std::allocator<QAM>_> *)local_318,(QAM *)local_360);
    std::__cxx11::string::~string((string *)&local_350);
    std::__cxx11::string::~string((string *)&local_280);
    local_328 = *(undefined8 *)(am->qam)._M_elems;
    uStack_320 = 0;
    iVar1 = (am->qam)._M_elems[2];
    iVar2 = (am->qam)._M_elems[3];
    std::__cxx11::string::string((string *)&local_2a0,"",&local_361);
    local_360._12_4_ = iVar2 + -2;
    local_360._0_4_ = (undefined4)local_328;
    local_360._4_4_ = (undefined4)((ulong)local_328 >> 0x20);
    if (local_2a0 == local_290) {
      local_340[8] = (undefined1)uStack_288;
      local_340[9] = uStack_288._1_1_;
      local_340[10] = uStack_288._2_1_;
      local_340[0xb] = uStack_288._3_1_;
      local_340[0xc] = uStack_288._4_1_;
      local_340[0xd] = uStack_288._5_1_;
      local_340[0xe] = uStack_288._6_1_;
      local_340[0xf] = uStack_288._7_1_;
      local_350._M_p = local_340;
    }
    else {
      local_350._M_p = local_2a0;
    }
    local_348 = local_298;
    local_298 = 0;
    local_290[0] = '\0';
    local_360._8_4_ = iVar1;
    local_2a0 = local_290;
    std::vector<QAM,_std::allocator<QAM>_>::emplace_back<QAM>
              ((vector<QAM,_std::allocator<QAM>_> *)local_318,(QAM *)local_360);
    std::__cxx11::string::~string((string *)&local_350);
    std::__cxx11::string::~string((string *)&local_2a0);
    iVar1 = (am->qam)._M_elems[0];
    iVar2 = (am->qam)._M_elems[3];
    local_328 = *(undefined8 *)((am->qam)._M_elems + 1);
    uStack_320 = 0;
    std::__cxx11::string::string((string *)&local_2c0,"",&local_361);
    local_360._12_4_ = iVar2 + -1;
    local_360._0_4_ = iVar1 + -1;
    local_360._4_4_ = (undefined4)local_328;
    local_360._8_4_ = (undefined4)((ulong)local_328 >> 0x20);
    if (local_2c0 == local_2b0) {
      local_340[8] = (undefined1)uStack_2a8;
      local_340[9] = uStack_2a8._1_1_;
      local_340[10] = uStack_2a8._2_1_;
      local_340[0xb] = uStack_2a8._3_1_;
      local_340[0xc] = uStack_2a8._4_1_;
      local_340[0xd] = uStack_2a8._5_1_;
      local_340[0xe] = uStack_2a8._6_1_;
      local_340[0xf] = uStack_2a8._7_1_;
      local_350._M_p = local_340;
    }
    else {
      local_350._M_p = local_2c0;
    }
    local_348 = local_2b8;
    local_2b8 = 0;
    local_2b0[0] = '\0';
    local_2c0 = local_2b0;
    std::vector<QAM,_std::allocator<QAM>_>::emplace_back<QAM>
              ((vector<QAM,_std::allocator<QAM>_> *)local_318,(QAM *)local_360);
    std::__cxx11::string::~string((string *)&local_350);
    std::__cxx11::string::~string((string *)&local_2c0);
    iVar1 = (am->qam)._M_elems[0];
    iVar2 = (am->qam)._M_elems[1];
    iVar3 = (am->qam)._M_elems[2];
    iVar4 = (am->qam)._M_elems[3];
    std::__cxx11::string::string((string *)&local_2e0,"",&local_361);
    uVar7 = local_32c;
    local_360._12_4_ = iVar4 + -1;
    local_360._4_4_ = iVar2 + -1;
    if (local_2e0 == local_2d0) {
      local_340[8] = (undefined1)uStack_2c8;
      local_340[9] = uStack_2c8._1_1_;
      local_340[10] = uStack_2c8._2_1_;
      local_340[0xb] = uStack_2c8._3_1_;
      local_340[0xc] = uStack_2c8._4_1_;
      local_340[0xd] = uStack_2c8._5_1_;
      local_340[0xe] = uStack_2c8._6_1_;
      local_340[0xf] = uStack_2c8._7_1_;
      local_350._M_p = local_340;
    }
    else {
      local_350._M_p = local_2e0;
    }
    local_348 = local_2d8;
    local_2d8 = 0;
    local_2d0[0] = '\0';
    local_360._0_4_ = iVar1;
    local_360._8_4_ = iVar3;
    local_2e0 = local_2d0;
    std::vector<QAM,_std::allocator<QAM>_>::emplace_back<QAM>
              ((vector<QAM,_std::allocator<QAM>_> *)local_318,(QAM *)local_360);
    std::__cxx11::string::~string((string *)&local_350);
    this_00 = (string *)&local_2e0;
    break;
  default:
    goto switchD_0010addc_default;
  }
  std::__cxx11::string::~string(this_00);
switchD_0010addc_default:
  uVar5 = local_318._8_8_;
  if ((char)uVar7 == '\0') {
    (__return_storage_ptr__->super__Vector_base<QAM,_std::allocator<QAM>_>)._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    (__return_storage_ptr__->super__Vector_base<QAM,_std::allocator<QAM>_>)._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    (__return_storage_ptr__->super__Vector_base<QAM,_std::allocator<QAM>_>)._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    for (__x = (QAM *)local_318._0_8_; __x != (QAM *)uVar5; __x = __x + 1) {
      QAM::QAM((QAM *)local_60,__x);
      bVar6 = ValidQAM((QAM *)local_60);
      std::__cxx11::string::~string((string *)(local_60 + 0x10));
      if (bVar6) {
        std::vector<QAM,_std::allocator<QAM>_>::push_back(__return_storage_ptr__,__x);
      }
    }
  }
  else {
    (__return_storage_ptr__->super__Vector_base<QAM,_std::allocator<QAM>_>)._M_impl.
    super__Vector_impl_data._M_start = (pointer)local_318._0_8_;
    (__return_storage_ptr__->super__Vector_base<QAM,_std::allocator<QAM>_>)._M_impl.
    super__Vector_impl_data._M_finish = (pointer)local_318._8_8_;
    (__return_storage_ptr__->super__Vector_base<QAM,_std::allocator<QAM>_>)._M_impl.
    super__Vector_impl_data._M_end_of_storage = local_308;
    local_318 = (undefined1  [16])0x0;
    local_308 = (pointer)0x0;
  }
  std::vector<QAM,_std::allocator<QAM>_>::~vector((vector<QAM,_std::allocator<QAM>_> *)local_318);
  return __return_storage_ptr__;
}

Assistant:

QAMList OSTEI_VRR_Algorithm_Base::GenerateAMReq(QAM am, RRStepType rrstep, bool all) const
{
    QAMList req;
    switch(rrstep)
    {
        case RRStepType::I:
            req.push_back({am[0]-1, am[1]  , am[2]  , am[3]  });
            req.push_back({am[0]-2, am[1]  , am[2]  , am[3]  });
            req.push_back({am[0]-1, am[1]-1, am[2]  , am[3]  });
            req.push_back({am[0]-1, am[1]  , am[2]-1, am[3]  });
            req.push_back({am[0]-1, am[1]  , am[2]  , am[3]-1});
            break;
        case RRStepType::J:
            req.push_back({am[0]  , am[1]-1, am[2]  , am[3]  });
            req.push_back({am[0]-1, am[1]-1, am[2]  , am[3]  });
            req.push_back({am[0]  , am[1]-2, am[2]  , am[3]  });
            req.push_back({am[0]  , am[1]-1, am[2]-1, am[3]  });
            req.push_back({am[0]  , am[1]-1, am[2]  , am[3]-1});
            break;
        case RRStepType::K:
            req.push_back({am[0]  , am[1]  , am[2]-1, am[3]  });
            req.push_back({am[0]  , am[1]  , am[2]-2, am[3]  });
            req.push_back({am[0]  , am[1]  , am[2]-1, am[3]-1});
            req.push_back({am[0]-1, am[1]  , am[2]-1, am[3]  });
            req.push_back({am[0]  , am[1]-1, am[2]-1, am[3]  });
            break;
        case RRStepType::L:
            req.push_back({am[0]  , am[1]  , am[2]  , am[3]-1});
            req.push_back({am[0]  , am[1]  , am[2]-1, am[3]-1});
            req.push_back({am[0]  , am[1]  , am[2]  , am[3]-2});
            req.push_back({am[0]-1, am[1]  , am[2]  , am[3]-1});
            req.push_back({am[0]  , am[1]-1, am[2]  , am[3]-1});
            break;
    }

    // remove invalid quartets
    if(!all)
    {
        QAMList req2;
        for(const auto & it : req)
        {
            if(ValidQAM(it))
                req2.push_back(it);
        }
        return req2;
    }
    else
        return req;
}